

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O3

void MemoryProfiler::AccumulateData
               (ArenaMemoryDataSummary *arenaMemoryDataSummary,ArenaMemoryData *memoryData,
               bool reset)

{
  size_t *psVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  undefined3 in_register_00000011;
  
  sVar3 = memoryData->alignmentBytes;
  (arenaMemoryDataSummary->total).allocatedBytes =
       (arenaMemoryDataSummary->total).allocatedBytes + memoryData->allocatedBytes;
  (arenaMemoryDataSummary->total).alignmentBytes =
       (arenaMemoryDataSummary->total).alignmentBytes + sVar3;
  sVar3 = memoryData->freelistCount;
  (arenaMemoryDataSummary->total).freelistBytes =
       memoryData->freelistBytes + (arenaMemoryDataSummary->total).freelistBytes;
  (arenaMemoryDataSummary->total).freelistCount =
       sVar3 + (arenaMemoryDataSummary->total).freelistCount;
  sVar3 = memoryData->requestCount;
  (arenaMemoryDataSummary->total).requestBytes =
       memoryData->requestBytes + (arenaMemoryDataSummary->total).requestBytes;
  (arenaMemoryDataSummary->total).requestCount =
       sVar3 + (arenaMemoryDataSummary->total).requestCount;
  sVar3 = memoryData->reuseCount;
  (arenaMemoryDataSummary->total).reuseBytes =
       memoryData->reuseBytes + (arenaMemoryDataSummary->total).reuseBytes;
  (arenaMemoryDataSummary->total).reuseCount = sVar3 + (arenaMemoryDataSummary->total).reuseCount;
  if (CONCAT31(in_register_00000011,reset) == 0) {
    psVar1 = &(arenaMemoryDataSummary->total).resetCount;
    *psVar1 = *psVar1 + memoryData->resetCount;
  }
  uVar2 = (arenaMemoryDataSummary->max).alignmentBytes;
  uVar4 = memoryData->alignmentBytes;
  if (memoryData->alignmentBytes < uVar2) {
    uVar4 = uVar2;
  }
  uVar2 = (arenaMemoryDataSummary->max).allocatedBytes;
  (arenaMemoryDataSummary->max).alignmentBytes = uVar4;
  uVar4 = memoryData->allocatedBytes;
  if (memoryData->allocatedBytes < uVar2) {
    uVar4 = uVar2;
  }
  (arenaMemoryDataSummary->max).allocatedBytes = uVar4;
  uVar2 = (arenaMemoryDataSummary->max).freelistBytes;
  uVar4 = memoryData->freelistBytes;
  if (memoryData->freelistBytes < uVar2) {
    uVar4 = uVar2;
  }
  (arenaMemoryDataSummary->max).freelistBytes = uVar4;
  uVar2 = (arenaMemoryDataSummary->max).freelistCount;
  uVar4 = memoryData->freelistCount;
  if (memoryData->freelistCount < uVar2) {
    uVar4 = uVar2;
  }
  (arenaMemoryDataSummary->max).freelistCount = uVar4;
  uVar2 = (arenaMemoryDataSummary->max).requestBytes;
  uVar4 = memoryData->requestBytes;
  if (memoryData->requestBytes < uVar2) {
    uVar4 = uVar2;
  }
  (arenaMemoryDataSummary->max).requestBytes = uVar4;
  uVar2 = (arenaMemoryDataSummary->max).requestCount;
  uVar4 = memoryData->requestCount;
  if (memoryData->requestCount < uVar2) {
    uVar4 = uVar2;
  }
  (arenaMemoryDataSummary->max).requestCount = uVar4;
  uVar2 = (arenaMemoryDataSummary->max).reuseCount;
  uVar4 = memoryData->reuseCount;
  if (memoryData->reuseCount < uVar2) {
    uVar4 = uVar2;
  }
  (arenaMemoryDataSummary->max).reuseCount = uVar4;
  uVar2 = (arenaMemoryDataSummary->max).reuseBytes;
  uVar4 = memoryData->reuseBytes;
  if (memoryData->reuseBytes < uVar2) {
    uVar4 = uVar2;
  }
  (arenaMemoryDataSummary->max).reuseBytes = uVar4;
  if (!reset) {
    uVar2 = (arenaMemoryDataSummary->max).resetCount;
    uVar4 = memoryData->resetCount;
    if (memoryData->resetCount < uVar2) {
      uVar4 = uVar2;
    }
    (arenaMemoryDataSummary->max).resetCount = uVar4;
  }
  return;
}

Assistant:

void
MemoryProfiler::AccumulateData(ArenaMemoryDataSummary * arenaMemoryDataSummary,  ArenaMemoryData * memoryData, bool reset)
{
    arenaMemoryDataSummary->total.alignmentBytes += memoryData->alignmentBytes;
    arenaMemoryDataSummary->total.allocatedBytes += memoryData->allocatedBytes;
    arenaMemoryDataSummary->total.freelistBytes += memoryData->freelistBytes;
    arenaMemoryDataSummary->total.freelistCount += memoryData->freelistCount;
    arenaMemoryDataSummary->total.requestBytes += memoryData->requestBytes;
    arenaMemoryDataSummary->total.requestCount += memoryData->requestCount;
    arenaMemoryDataSummary->total.reuseCount += memoryData->reuseCount;
    arenaMemoryDataSummary->total.reuseBytes += memoryData->reuseBytes;
    if (!reset)
    {
        arenaMemoryDataSummary->total.resetCount += memoryData->resetCount;
    }

    arenaMemoryDataSummary->max.alignmentBytes = max(arenaMemoryDataSummary->max.alignmentBytes, memoryData->alignmentBytes);
    arenaMemoryDataSummary->max.allocatedBytes = max(arenaMemoryDataSummary->max.allocatedBytes, memoryData->allocatedBytes);
    arenaMemoryDataSummary->max.freelistBytes = max(arenaMemoryDataSummary->max.freelistBytes, memoryData->freelistBytes);
    arenaMemoryDataSummary->max.freelistCount = max(arenaMemoryDataSummary->max.freelistCount, memoryData->freelistCount);
    arenaMemoryDataSummary->max.requestBytes = max(arenaMemoryDataSummary->max.requestBytes, memoryData->requestBytes);
    arenaMemoryDataSummary->max.requestCount = max(arenaMemoryDataSummary->max.requestCount, memoryData->requestCount);
    arenaMemoryDataSummary->max.reuseCount = max(arenaMemoryDataSummary->max.reuseCount, memoryData->reuseCount);
    arenaMemoryDataSummary->max.reuseBytes = max(arenaMemoryDataSummary->max.reuseBytes, memoryData->reuseBytes);
    if (!reset)
    {
        arenaMemoryDataSummary->max.resetCount = max(arenaMemoryDataSummary->max.resetCount, memoryData->resetCount);
    }
}